

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O2

bool __thiscall QNetworkAccessCacheBackend::sendCacheContents(QNetworkAccessCacheBackend *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  Operation OVar4;
  QAbstractNetworkCache *pQVar5;
  QIODevice *pQVar6;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QUrl local_88;
  undefined1 local_80 [16];
  QHttpHeaders headers;
  AttributesMap attributes;
  QNetworkCacheMetaData item;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  QNetworkAccessBackend::setCachingEnabled((QNetworkAccessBackend *)this,false);
  pQVar5 = QNetworkAccessBackend::networkCache((QNetworkAccessBackend *)this);
  if (pQVar5 != (QAbstractNetworkCache *)0x0) {
    item.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkAccessBackend::url((QNetworkAccessBackend *)local_58.data);
    (**(code **)(*(long *)pQVar5 + 0x60))(&item,pQVar5,&local_58);
    QUrl::~QUrl((QUrl *)&local_58.shared);
    bVar2 = QNetworkCacheMetaData::isValid(&item);
    if (bVar2) {
      attributes.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkCacheMetaData::attributes(&item);
      auVar1._12_4_ = 0;
      auVar1._0_12_ = local_80._4_12_;
      local_80 = auVar1 << 0x20;
      QHash<QNetworkRequest::Attribute,_QVariant>::value
                ((QVariant *)&local_58,&attributes,(Attribute *)local_80);
      bVar2 = false;
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,HttpStatusCodeAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      local_80._0_4_ = 1;
      QHash<QNetworkRequest::Attribute,_QVariant>::value
                ((QVariant *)&local_58,&attributes,(Attribute *)local_80);
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,HttpReasonPhraseAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      headers.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)&headers);
      local_80 = (undefined1  [16])
                 QHttpHeaders::value(&headers,CacheControl,(QByteArrayView)ZEXT816(0));
      s.m_data = "must-revalidate";
      s.m_size = 0xf;
      bVar3 = QLatin1String::contains((QLatin1String *)local_80,s,CaseInsensitive);
      if (!bVar3) {
        bVar2 = false;
        s_00.m_data = "no-cache";
        s_00.m_size = 8;
        bVar3 = QLatin1String::contains((QLatin1String *)local_80,s_00,CaseInsensitive);
        if (!bVar3) {
          QNetworkAccessBackend::setHeaders((QNetworkAccessBackend *)this,&headers);
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88.d._0_4_ = 2;
          QHash<QNetworkRequest::Attribute,_QVariant>::value
                    ((QVariant *)&local_58,&attributes,(Attribute *)&local_88);
          if ((undefined1 *)0x3 < puStack_40) {
            QNetworkAccessBackend::setAttribute
                      ((QNetworkAccessBackend *)this,RedirectionTargetAttribute,
                       (QVariant *)&local_58);
            QVariant::toUrl();
            QNetworkAccessBackend::redirectionRequested((QNetworkAccessBackend *)this,&local_88);
            QUrl::~QUrl(&local_88);
          }
          QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)this);
          OVar4 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
          bVar2 = true;
          if (OVar4 == GetOperation) {
            QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_88);
            pQVar6 = (QIODevice *)(**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,&local_88);
            this->device = pQVar6;
            QUrl::~QUrl(&local_88);
            if ((QObject *)this->device == (QObject *)0x0) {
              bVar2 = false;
            }
            else {
              QObject::setParent((QObject *)this->device);
              QNetworkAccessBackend::readyRead((QNetworkAccessBackend *)this);
            }
          }
          QVariant::~QVariant((QVariant *)&local_58);
        }
      }
      QHttpHeaders::~QHttpHeaders(&headers);
      QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&attributes);
    }
    else {
      bVar2 = false;
    }
    QNetworkCacheMetaData::~QNetworkCacheMetaData(&item);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkAccessCacheBackend::sendCacheContents()
{
    setCachingEnabled(false);
    QAbstractNetworkCache *nc = networkCache();
    if (!nc)
        return false;

    QNetworkCacheMetaData item = nc->metaData(url());
    if (!item.isValid())
        return false;

    QNetworkCacheMetaData::AttributesMap attributes = item.attributes();
    setAttribute(QNetworkRequest::HttpStatusCodeAttribute,
                 attributes.value(QNetworkRequest::HttpStatusCodeAttribute));
    setAttribute(QNetworkRequest::HttpReasonPhraseAttribute,
                 attributes.value(QNetworkRequest::HttpReasonPhraseAttribute));

    // set the headers
    auto headers = item.headers();
    const auto cacheControlValue = QLatin1StringView(
            headers.value(QHttpHeaders::WellKnownHeader::CacheControl));
    // RFC 9111 Section 5.2 Cache Control
    if (cacheControlValue.contains("must-revalidate"_L1, Qt::CaseInsensitive)
        || cacheControlValue.contains("no-cache"_L1, Qt::CaseInsensitive)) {
        return false;
    }
    setHeaders(std::move(headers));

    // handle a possible redirect
    QVariant redirectionTarget = attributes.value(QNetworkRequest::RedirectionTargetAttribute);
    if (redirectionTarget.isValid()) {
        setAttribute(QNetworkRequest::RedirectionTargetAttribute, redirectionTarget);
        redirectionRequested(redirectionTarget.toUrl());
    }

    // signal we're open
    metaDataChanged();

    if (operation() == QNetworkAccessManager::GetOperation) {
        device = nc->data(url());
        if (!device)
            return false;
        device->setParent(this);
        readyRead();
    }

#if defined(QNETWORKACCESSCACHEBACKEND_DEBUG)
    qDebug() << "Successfully sent cache:" << url();
#endif
    return true;
}